

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathQuat.h
# Opt level: O2

Quat<float> * __thiscall Imath_2_5::Quat<float>::normalize(Quat<float> *this)

{
  float a;
  
  a = length(this);
  if ((a != 0.0) || (NAN(a))) {
    this->r = this->r / a;
    Vec3<float>::operator/=(&this->v,a);
  }
  else {
    this->r = 1.0;
    (this->v).x = 0.0;
    (this->v).y = 0.0;
    (this->v).z = 0.0;
  }
  return this;
}

Assistant:

inline Quat<T> &
Quat<T>::normalize ()
{
    if (T l = length())
    {
	r /= l;
	v /= l;
    }
    else
    {
	r = 1;
	v = Vec3<T> (0);
    }

    return *this;
}